

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O0

int __thiscall Polynomial::copy(Polynomial *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  double *pdVar4;
  int in_ECX;
  int i;
  int local_20;
  
  this->ocount = in_ECX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ECX;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar3);
  this->osx = pdVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ECX;
  uVar3 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar3);
  this->osy = pdVar4;
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    this->osx[local_20] = *(double *)(dst + (long)local_20 * 8);
    this->osy[local_20] = *(double *)(src + (long)local_20 * 8);
  }
  return local_20;
}

Assistant:

void Polynomial::copy(double *x, double *y, int count)
{
    ocount = count;
    osx = new double[count] , osy = new double[count];
    for(int i(0) ; i < count ; i++)
    {
        osx[i] = x[i] ;
        osy[i] = y[i] ;
    }
}